

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int secp_key_exchange(ptls_key_exchange_algorithm_t *algo,ptls_iovec_t *pubkey,ptls_iovec_t *secret,
                     ptls_iovec_t peerkey)

{
  EC_GROUP *group_00;
  int local_44;
  BN_CTX *pBStack_40;
  int ret;
  BN_CTX *bn_ctx;
  EC_GROUP *group;
  ptls_iovec_t *secret_local;
  ptls_iovec_t *pubkey_local;
  ptls_key_exchange_algorithm_t *algo_local;
  ptls_iovec_t peerkey_local;
  
  pBStack_40 = (BN_CTX *)0x0;
  group_00 = EC_GROUP_new_by_curve_name((int)algo->data);
  if (group_00 == (EC_GROUP *)0x0) {
    local_44 = 0x203;
  }
  else {
    pBStack_40 = BN_CTX_new();
    if (pBStack_40 == (BN_CTX *)0x0) {
      local_44 = 0x201;
    }
    else {
      local_44 = x9_62_key_exchange((EC_GROUP *)group_00,pubkey,secret,peerkey,(BN_CTX *)pBStack_40)
      ;
    }
  }
  if (pBStack_40 != (BN_CTX *)0x0) {
    BN_CTX_free(pBStack_40);
  }
  if (group_00 != (EC_GROUP *)0x0) {
    EC_GROUP_free(group_00);
  }
  return local_44;
}

Assistant:

static int secp_key_exchange(ptls_key_exchange_algorithm_t *algo, ptls_iovec_t *pubkey, ptls_iovec_t *secret, ptls_iovec_t peerkey)
{
    EC_GROUP *group = NULL;
    BN_CTX *bn_ctx = NULL;
    int ret;

    if ((group = EC_GROUP_new_by_curve_name((int)algo->data)) == NULL) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    if ((bn_ctx = BN_CTX_new()) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }

    ret = x9_62_key_exchange(group, pubkey, secret, peerkey, bn_ctx);

Exit:
    if (bn_ctx != NULL)
        BN_CTX_free(bn_ctx);
    if (group != NULL)
        EC_GROUP_free(group);
    return ret;
}